

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Value
chaiscript::Boxed_Number::binary_int_go<unsigned_short,long>
          (Opers t_oper,unsigned_short *t,long *u,Boxed_Value *t_lhs)

{
  undefined8 uVar1;
  long *in_RCX;
  ushort *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffffa8;
  Boxed_Value *in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0x10:
    *in_RDX = *in_RDX & (ushort)*in_RCX;
    break;
  case 0x11:
    *in_RDX = *in_RDX | (ushort)*in_RCX;
    break;
  case 0x12:
    *in_RDX = *in_RDX << ((byte)*in_RCX & 0x1f);
    break;
  case 0x13:
    *in_RDX = (ushort)((int)(uint)*in_RDX >> ((byte)*in_RCX & 0x1f));
    break;
  case 0x14:
    check_divide_by_zero<long>(CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    *in_RDX = (ushort)((long)(ulong)*in_RDX % *in_RCX);
    break;
  case 0x15:
    *in_RDX = *in_RDX ^ (ushort)*in_RCX;
    break;
  default:
    uVar1 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast((bad_any_cast *)in_RDI);
    __cxa_throw(uVar1,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  Boxed_Value::Boxed_Value(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_int_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign_bitwise_and:
            t &= u;
            break;
          case Operators::assign_bitwise_or:
            t |= u;
            break;
          case Operators::assign_shift_left:
            t <<= u;
            break;
          case Operators::assign_shift_right:
            t >>= u;
            break;
          case Operators::assign_remainder:
            check_divide_by_zero(u);
            t %= u;
            break;
          case Operators::assign_bitwise_xor:
            t ^= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
        return t_lhs;
      }